

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  DescriptorDatabase *pDVar1;
  byte bVar2;
  int iVar3;
  pointer ppDVar4;
  string *unaff_R12;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  undefined1 local_108 [8];
  FileDescriptorProto temp;
  
  ppDVar4 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sources_).
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar4) {
    uVar5 = 0;
    do {
      iVar3 = (*ppDVar4[uVar5]->_vptr_DescriptorDatabase[4])
                        (ppDVar4[uVar5],containing_type,(ulong)(uint)field_number,output);
      if ((char)iVar3 != '\0') {
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
        bVar7 = true;
        if (uVar5 == 0) goto LAB_002af0e1;
        uVar6 = 0;
        bVar7 = false;
        goto LAB_002af0b5;
      }
      uVar5 = uVar5 + 1;
      ppDVar4 = (this->sources_).
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      unaff_R12 = containing_type;
    } while (uVar5 < (ulong)((long)(this->sources_).
                                   super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3))
    ;
  }
  bVar7 = (byte)unaff_R12;
  bVar2 = 0;
  goto LAB_002af0ef;
  while( true ) {
    uVar6 = uVar6 + 1;
    bVar7 = uVar5 <= uVar6;
    if (uVar6 == uVar5) break;
LAB_002af0b5:
    pDVar1 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
    iVar3 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,(output->name_).ptr_,local_108);
    if ((char)iVar3 != '\0') break;
  }
LAB_002af0e1:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  bVar2 = 1;
LAB_002af0ef:
  return (bool)(bVar2 & bVar7);
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(containing_type, field_number,
                                                 output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}